

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_update_intra_mb_txb_context
               (AV1_COMP *cpi,ThreadData_conflict *td,RUN_TYPE dry_run,BLOCK_SIZE bsize,
               uint8_t allow_update_cdf)

{
  int iVar1;
  AV1_COMMON *cm_00;
  code *arg_00;
  BLOCK_SIZE in_CL;
  foreach_transformed_block_visitor in_RSI;
  long in_RDI;
  BLOCK_SIZE plane_bsize;
  int ss_y;
  int ss_x;
  macroblockd_plane *pd;
  int plane;
  foreach_transformed_block_visitor visit;
  tokenize_b_args arg;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int num_planes;
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  BLOCK_SIZE bsize_00;
  int iVar2;
  MACROBLOCKD *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffd8;
  
  bsize_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff9c >> 0x18);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  iVar1 = av1_num_planes(cm_00);
  arg_00 = in_RSI + 0x1a0;
  if (*(char *)(**(long **)(in_RSI + 0x2058) + 0x90) == '\0') {
    iVar2 = 0;
    while ((iVar2 < iVar1 && ((iVar2 == 0 || (((byte)arg_00[0xc] & 1) != 0))))) {
      get_plane_block_size
                (in_CL,*(int *)(arg_00 + (long)iVar2 * 0xa30 + 0x14),
                 *(int *)(arg_00 + (long)iVar2 * 0xa30 + 0x18));
      av1_foreach_transformed_block_in_plane
                ((MACROBLOCKD *)cm_00,(BLOCK_SIZE)((uint)iVar1 >> 0x18),in_stack_ffffffffffffffd8,
                 in_RSI,arg_00);
      iVar2 = iVar2 + 1;
    }
  }
  else {
    av1_reset_entropy_context(in_stack_ffffffffffffffa0,bsize_00,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void av1_update_intra_mb_txb_context(const AV1_COMP *cpi, ThreadData *td,
                                     RUN_TYPE dry_run, BLOCK_SIZE bsize,
                                     uint8_t allow_update_cdf) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  struct tokenize_b_args arg = { cpi, td, 0, allow_update_cdf, dry_run };
  if (mbmi->skip_txfm) {
    av1_reset_entropy_context(xd, bsize, num_planes);
    return;
  }
  const foreach_transformed_block_visitor visit =
      allow_update_cdf ? av1_update_and_record_txb_context
                       : av1_record_txb_context;

  for (int plane = 0; plane < num_planes; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const struct macroblockd_plane *const pd = &xd->plane[plane];
    const int ss_x = pd->subsampling_x;
    const int ss_y = pd->subsampling_y;
    const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
    av1_foreach_transformed_block_in_plane(xd, plane_bsize, plane, visit, &arg);
  }
}